

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::predict_or_learn<false>(csoaa *c,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  features *pfVar3;
  float *pfVar4;
  uint64_t uVar5;
  wclass *cl;
  wclass *pwVar6;
  uint32_t i;
  uint uVar7;
  uint64_t i_00;
  long lVar8;
  polyprediction *ppVar9;
  unsigned_long uVar10;
  float fVar11;
  uint32_t prediction;
  wclass *local_60;
  float score;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pwVar6 = (ec->l).cs.costs._begin;
  local_60 = (ec->l).cs.costs._end;
  local_48 = (ec->l).cs.costs.end_array;
  uStack_40 = (ec->l).cs.costs.erase_count;
  prediction = 1;
  score = 3.4028235e+38;
  pfVar3 = ec->passthrough;
  if (pfVar3 == (features *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)(pfVar3->values)._end - (long)(pfVar3->values)._begin >> 2;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  local_50 = pwVar6;
  if (local_60 == pwVar6) {
    (ec->l).multi.label = 0x7f7fffff;
    (ec->l).simple.initial = 0.0;
    LEARNER::learner<char,_example>::multipredict(base,ec,0,(ulong)c->num_classes,c->pred,false);
    uVar5 = 1;
    i_00 = 1;
    while (uVar7 = (uint)i_00, uVar7 <= c->num_classes) {
      add_passthrough_feature_magic(ec,0x398d4541,i_00,c->pred[uVar7 - 1].scalar);
      fVar1 = c->pred[(int)uVar5 - 1].scalar;
      ppVar9 = c->pred + (uVar7 - 1);
      if (ppVar9->scalar <= fVar1 && fVar1 != ppVar9->scalar) {
        uVar5 = i_00;
        prediction = uVar7;
      }
      i_00 = (uint64_t)(uVar7 + 1);
    }
    ppVar9 = c->pred + ((int)uVar5 - 1);
  }
  else {
    ppVar9 = (polyprediction *)&score;
    for (; pwVar6 != local_60; pwVar6 = pwVar6 + 1) {
      inner_loop<false>(base,ec,pwVar6->class_index,pwVar6->x,&prediction,&ppVar9->scalar,
                        &pwVar6->partial_prediction);
    }
  }
  fVar1 = ppVar9->scalar;
  ec->partial_prediction = fVar1;
  pfVar3 = ec->passthrough;
  if (pfVar3 != (features *)0x0) {
    pfVar4 = (pfVar3->values)._begin;
    fVar11 = 3.4028235e+38;
    uVar10 = 0;
    for (; (long)(pfVar3->values)._end - (long)pfVar4 >> 2 != lVar8; lVar8 = lVar8 + 1) {
      fVar2 = pfVar4[lVar8];
      if ((fVar1 < fVar2) && (fVar2 < fVar11)) {
        uVar10 = (pfVar3->indicies)._begin[lVar8];
        fVar11 = fVar2;
      }
    }
    uVar5 = 0x2155014;
    if (fVar11 < 3.4028235e+38) {
      add_passthrough_feature_magic(ec,0x398d4541,0x1638ab8,fVar11 - fVar1);
      uVar5 = uVar10 + 0x1638ab9;
    }
    add_passthrough_feature_magic(ec,0x398d4541,uVar5,1.0);
  }
  (ec->pred).multiclass = prediction;
  (ec->l).cs.costs._begin = (wclass *)local_50;
  (ec->l).cs.costs._end = local_60;
  (ec->l).cs.costs.end_array = (wclass *)local_48;
  (ec->l).cs.costs.erase_count = uStack_40;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}